

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgMatrix.cpp
# Opt level: O2

void __thiscall
dgMatrix::TransformBBox
          (dgMatrix *this,dgVector *p0local,dgVector *p1local,dgVector *p0,dgVector *p1)

{
  uint *puVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar5;
  undefined8 uVar4;
  undefined4 uVar6;
  long lVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  ulong uStack_a0;
  dgVector box [8];
  
  box[0].super_dgTemplateVector<float>.m_x = (p0local->super_dgTemplateVector<float>).m_x;
  box[0].super_dgTemplateVector<float>.m_y = (p0local->super_dgTemplateVector<float>).m_y;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = box[0].super_dgTemplateVector<float>._0_8_;
  box[0].super_dgTemplateVector<float>.m_z = (p0local->super_dgTemplateVector<float>).m_z;
  box[0].super_dgTemplateVector<float>.m_w = 1.0;
  box[2].super_dgTemplateVector<float>.m_w = 1.0;
  auVar8 = vmovshdup_avx(auVar8);
  box[3].super_dgTemplateVector<float>.m_y = (p1local->super_dgTemplateVector<float>).m_y;
  box[3].super_dgTemplateVector<float>.m_z = (p1local->super_dgTemplateVector<float>).m_z;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = box[3].super_dgTemplateVector<float>._4_8_;
  auVar10 = vmovshdup_avx(auVar10);
  box[1].super_dgTemplateVector<float>.m_z = auVar10._0_4_;
  box[3].super_dgTemplateVector<float>.m_w = 1.0;
  box[4].super_dgTemplateVector<float>.m_x = (p1local->super_dgTemplateVector<float>).m_x;
  box[4].super_dgTemplateVector<float>.m_y = auVar8._0_4_;
  box[4].super_dgTemplateVector<float>.m_w = 1.0;
  box[1].super_dgTemplateVector<float>.m_w = 1.0;
  box[6].super_dgTemplateVector<float>.m_w = 1.0;
  box[7].super_dgTemplateVector<float>.m_w = 1.0;
  uStack_a0 = 0xd9eee4;
  box[1].super_dgTemplateVector<float>._0_8_ = box[0].super_dgTemplateVector<float>._0_8_;
  box[2].super_dgTemplateVector<float>.m_x = box[0].super_dgTemplateVector<float>.m_x;
  box[2].super_dgTemplateVector<float>.m_y = (float)box[3].super_dgTemplateVector<float>.m_y;
  box[2].super_dgTemplateVector<float>.m_z = box[0].super_dgTemplateVector<float>.m_z;
  box[3].super_dgTemplateVector<float>.m_x = box[0].super_dgTemplateVector<float>.m_x;
  box[4].super_dgTemplateVector<float>.m_z = box[0].super_dgTemplateVector<float>.m_z;
  box[5].super_dgTemplateVector<float>.m_x = box[4].super_dgTemplateVector<float>.m_x;
  box[5].super_dgTemplateVector<float>.m_y = box[4].super_dgTemplateVector<float>.m_y;
  box[5].super_dgTemplateVector<float>.m_z = box[1].super_dgTemplateVector<float>.m_z;
  box[6].super_dgTemplateVector<float>.m_x = box[4].super_dgTemplateVector<float>.m_x;
  box[6].super_dgTemplateVector<float>.m_y = (float)box[3].super_dgTemplateVector<float>.m_y;
  box[6].super_dgTemplateVector<float>.m_z = box[0].super_dgTemplateVector<float>.m_z;
  box[7].super_dgTemplateVector<float>.m_x = box[4].super_dgTemplateVector<float>.m_x;
  box[7].super_dgTemplateVector<float>._4_8_ = box[3].super_dgTemplateVector<float>._4_8_;
  TransformTriplex(this,(HaF32 *)box,0x10,(HaF32 *)box,0x10,8);
  (p0->super_dgTemplateVector<float>).m_x = box[0].super_dgTemplateVector<float>.m_x;
  (p0->super_dgTemplateVector<float>).m_y = box[0].super_dgTemplateVector<float>.m_y;
  (p0->super_dgTemplateVector<float>).m_z = box[0].super_dgTemplateVector<float>.m_z;
  (p0->super_dgTemplateVector<float>).m_w = box[0].super_dgTemplateVector<float>.m_w;
  (p1->super_dgTemplateVector<float>).m_x = box[0].super_dgTemplateVector<float>.m_x;
  (p1->super_dgTemplateVector<float>).m_y = box[0].super_dgTemplateVector<float>.m_y;
  (p1->super_dgTemplateVector<float>).m_z = box[0].super_dgTemplateVector<float>.m_z;
  (p1->super_dgTemplateVector<float>).m_w = box[0].super_dgTemplateVector<float>.m_w;
  lVar7 = 0x18;
  while (lVar7 != 0x88) {
    uVar2 = (p0->super_dgTemplateVector<float>).m_x;
    uVar5 = (p0->super_dgTemplateVector<float>).m_y;
    auVar9._4_4_ = uVar5;
    auVar9._0_4_ = uVar2;
    auVar9._8_8_ = 0;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = *(ulong *)((long)box + lVar7 + -8);
    auVar8 = vminps_avx(auVar11,auVar9);
    uVar4 = vmovlps_avx(auVar8);
    (p0->super_dgTemplateVector<float>).m_x = (float)(int)uVar4;
    (p0->super_dgTemplateVector<float>).m_y = (float)(int)((ulong)uVar4 >> 0x20);
    puVar1 = (uint *)((long)&box[0].super_dgTemplateVector<float>.m_x + lVar7);
    lVar7 = lVar7 + 0x10;
    auVar10 = ZEXT416(*puVar1);
    auVar8 = vminss_avx(auVar10,ZEXT416((uint)(p0->super_dgTemplateVector<float>).m_z));
    (p0->super_dgTemplateVector<float>).m_z = auVar8._0_4_;
    uVar3 = (p1->super_dgTemplateVector<float>).m_x;
    uVar6 = (p1->super_dgTemplateVector<float>).m_y;
    auVar12._4_4_ = uVar6;
    auVar12._0_4_ = uVar3;
    auVar12._8_8_ = 0;
    auVar8 = vmaxps_avx(auVar11,auVar12);
    uVar4 = vmovlps_avx(auVar8);
    (p1->super_dgTemplateVector<float>).m_x = (float)(int)uVar4;
    (p1->super_dgTemplateVector<float>).m_y = (float)(int)((ulong)uVar4 >> 0x20);
    auVar8 = vmaxss_avx(auVar10,ZEXT416((uint)(p1->super_dgTemplateVector<float>).m_z));
    (p1->super_dgTemplateVector<float>).m_z = auVar8._0_4_;
  }
  return;
}

Assistant:

void dgMatrix::TransformBBox (const dgVector& p0local, const dgVector& p1local, dgVector& p0, dgVector& p1) const
{
	dgVector box[8];

	box[0][0] = p0local[0];
	box[0][1] = p0local[1];
	box[0][2] = p0local[2];
	box[0][3] = hacd::HaF32(1.0f);

	box[1][0] = p0local[0];
	box[1][1] = p0local[1];
	box[1][2] = p1local[2];
	box[1][3] = hacd::HaF32(1.0f);

	box[2][0] = p0local[0];
	box[2][1] = p1local[1];
	box[2][2] = p0local[2];
	box[2][3] = hacd::HaF32(1.0f);

	box[3][0] = p0local[0];
	box[3][1] = p1local[1];
	box[3][2] = p1local[2];
	box[3][3] = hacd::HaF32(1.0f);

	box[4][0] = p1local[0];
	box[4][1] = p0local[1];
	box[4][2] = p0local[2];
	box[4][3] = hacd::HaF32(1.0f);

	box[5][0] = p1local[0];
	box[5][1] = p0local[1];
	box[5][2] = p1local[2];
	box[1][3] = hacd::HaF32(1.0f);

	box[6][0] = p1local[0];
	box[6][1] = p1local[1];
	box[6][2] = p0local[2];
	box[6][3] = hacd::HaF32(1.0f);

	box[7][0] = p1local[0];
	box[7][1] = p1local[1];
	box[7][2] = p1local[2];
	box[7][3] = hacd::HaF32(1.0f);

	TransformTriplex (&box[0].m_x, sizeof (dgVector), &box[0].m_x, sizeof (dgVector), 8);

	p0 = box[0];
	p1 = box[0];
	for (hacd::HaI32 i = 1; i < 8; i ++) {
		p0.m_x = GetMin (p0.m_x, box[i].m_x);
		p0.m_y = GetMin (p0.m_y, box[i].m_y);
		p0.m_z = GetMin (p0.m_z, box[i].m_z);

		p1.m_x = GetMax (p1.m_x, box[i].m_x);
		p1.m_y = GetMax (p1.m_y, box[i].m_y);
		p1.m_z = GetMax (p1.m_z, box[i].m_z);
	}
}